

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

int __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
RemoveEntry(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
            *this,int i,int previous,uint bucket)

{
  int iVar1;
  WeakRefDictionaryEntry<Js::Type,_bool> *pWVar2;
  Type p_Var3;
  int *piVar4;
  
  pWVar2 = (this->entries).ptr;
  piVar4 = &pWVar2[(uint)previous].next;
  if (previous < 0) {
    piVar4 = (this->buckets).ptr + bucket;
  }
  iVar1 = pWVar2[i].next;
  *piVar4 = iVar1;
  p_Var3 = (this->entryRemovalCallback).fnCallback;
  if (p_Var3 != (Type)0x0) {
    (*p_Var3)(pWVar2 + i,(this->entryRemovalCallback).cookie.ptr);
  }
  pWVar2 = (this->entries).ptr;
  pWVar2[i].next = this->freeList;
  pWVar2[i].key.ptr = (RecyclerWeakReference<Js::Type> *)0x0;
  (this->entries).ptr[i].hash = 0;
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  this->version = this->version + 1;
  return iVar1;
}

Assistant:

int RemoveEntry(int i, int previous, uint bucket)
        {
            int next = entries[i].next;

            if (previous < 0) // Previous < 0 => first node
            {
                buckets[bucket] = entries[i].next;
            }
            else
            {
                entries[previous].next = entries[i].next;
            }

            if (this->entryRemovalCallback.fnCallback != nullptr)
            {
                this->entryRemovalCallback.fnCallback(entries[i], this->entryRemovalCallback.cookie);
            }

            entries[i].next = freeList;
            entries[i].key = nullptr;
            entries[i].hash = EntryType::INVALID_HASH_VALUE;
            // Hold onto the pid here so that we can reuse it
            // entries[i].value = nullptr;
            freeList = i;
            freeCount++;
            version++;

            return next;
        }